

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

shared_ptr<kratos::FunctionStmtBlock> __thiscall kratos::FSM::get_func_def(FSM *this)

{
  _Rb_tree_header *p_Var1;
  shared_ptr<kratos::Var> *var;
  StmtBlock *this_00;
  undefined4 uVar2;
  ulong uVar3;
  long *plVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  long *plVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  long *in_RSI;
  long *plVar9;
  double dVar10;
  shared_ptr<kratos::FunctionStmtBlock> sVar11;
  undefined1 local_110 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
  name_mapping;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ports;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  pointer local_88;
  _Base_ptr local_80;
  shared_ptr<kratos::Stmt> local_78;
  undefined1 local_68 [16];
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> function_name;
  
  local_58 = (pointer)&function_name._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)(local_68 + 0x10),*in_RSI,in_RSI[1] + *in_RSI)
  ;
  std::__cxx11::string::append((char *)(local_68 + 0x10));
  Generator::function((Generator *)this,(string *)in_RSI[4]);
  local_110 = (undefined1  [8])&name_mapping._M_h._M_rehash_policy._M_next_resize;
  name_mapping._M_h._M_buckets = (__buckets_ptr)0x1;
  name_mapping._M_h._M_bucket_count = 0;
  name_mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  name_mapping._M_h._M_element_count._0_4_ = 0x3f800000;
  name_mapping._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  name_mapping._M_h._M_rehash_policy._4_4_ = 0;
  name_mapping._M_h._M_rehash_policy._M_next_resize = 0;
  dVar10 = ((double)CONCAT44(0x45300000,(int)((ulong)in_RSI[8] >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)in_RSI[8]) - 4503599627370496.0);
  uVar3 = (ulong)dVar10;
  function_name.field_2._8_8_ = this;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_110,(long)(dVar10 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3);
  plVar9 = (long *)in_RSI[7];
  if (plVar9 != (long *)0x0) {
    p_Var1 = &ports._M_t._M_impl.super__Rb_tree_header;
    do {
      (**(code **)(*(long *)plVar9[1] + 0xf8))(&local_78);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
      plVar7 = plVar4 + 2;
      if ((_Rb_tree_header *)*plVar4 == (_Rb_tree_header *)plVar7) {
        ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar7;
        ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)plVar4[3];
        local_c8 = (undefined1  [8])p_Var1;
      }
      else {
        ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = *plVar7;
        local_c8 = (undefined1  [8])*plVar4;
      }
      ports._M_t._M_impl._0_8_ = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_78.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_68) {
        operator_delete(local_78.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ,local_68._0_8_ + 1);
      }
      plVar4 = plVar9 + 1;
      plVar7 = *(long **)function_name.field_2._8_8_;
      uVar2 = (**(code **)(*(long *)*plVar4 + 0x38))();
      (**(code **)(*plVar7 + 0x68))
                (&name_mapping._M_h._M_single_bucket,plVar7,local_c8,uVar2,
                 *(undefined1 *)(*plVar4 + 0xf0));
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      }
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,kratos::Var*const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_110,local_c8,plVar4);
      if (local_c8 != (undefined1  [8])p_Var1) {
        operator_delete((void *)local_c8,
                        ports._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ + 1);
      }
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)local_c8,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
              *)(*(long *)function_name.field_2._8_8_ + 0x108));
  if (ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Rb_tree_node_base *)&ports)
  {
    p_Var6 = ports._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      iVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_110,(key_type *)(p_Var6 + 1));
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      var = *(shared_ptr<kratos::Var> **)
             ((long)iVar5.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_true>
                    ._M_cur + 0x28);
      this_00 = *(StmtBlock **)function_name.field_2._8_8_;
      local_88 = *(pointer *)(p_Var6 + 2);
      local_80 = p_Var6[2]._M_parent;
      if (local_80 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&local_80->_M_parent = *(int *)&local_80->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&local_80->_M_parent = *(int *)&local_80->_M_parent + 1;
        }
      }
      Var::assign((Var *)&ports._M_t._M_impl.super__Rb_tree_header._M_node_count,var,
                  (AssignmentType)&local_88);
      local_78.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)ports._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_78.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Stack_90;
      ports._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      StmtBlock::add_stmt(this_00,&local_78);
      if (local_78.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_80 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != (_Rb_tree_node_base *)&ports);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Port>_>_>_>
               *)local_c8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_110);
  _Var8._M_pi = extraout_RDX;
  if (local_58 != (pointer)&function_name._M_string_length) {
    operator_delete(local_58,function_name._M_string_length + 1);
    _Var8._M_pi = extraout_RDX_00;
  }
  sVar11.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var8._M_pi;
  sVar11.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)function_name.field_2._8_8_;
  return (shared_ptr<kratos::FunctionStmtBlock>)
         sVar11.super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FunctionStmtBlock> FSM::get_func_def() {
    auto function_name = fsm_name_ + "_output";
    auto func = generator_->function(function_name);
    std::unordered_map<std::string, Var*> name_mapping;
    name_mapping.reserve(outputs_.size());
    // add outputs
    for (auto const& [var, _] : outputs_) {
        auto var_name = var->to_string() + "_value";
        func->input(var_name, var->width(), var->is_signed());
        name_mapping.emplace(var_name, var);
    }
    auto ports = func->ports();
    for (auto const& [var_name, port] : ports) {
        auto* var = name_mapping.at(var_name);
        func->add_stmt(var->assign(port, AssignmentType::Blocking));
    }
    return func;
}